

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O3

uint64_t __thiscall foxxll::block_manager::free_bytes(block_manager *this)

{
  size_t sVar1;
  uint64_t uVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->mutex_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if (this->ndisks_ == 0) {
    uVar2 = 0;
  }
  else {
    sVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (this->block_allocators_).array_[sVar1]->free_bytes_;
      sVar1 = sVar1 + 1;
    } while (this->ndisks_ != sVar1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return uVar2;
}

Assistant:

uint64_t block_manager::free_bytes() const
{
    std::unique_lock<std::mutex> lock(mutex_);

    uint64_t total = 0;

    for (size_t i = 0; i < ndisks_; ++i)
        total += block_allocators_[i]->free_bytes();

    return total;
}